

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void CreateDefaultArgumentFunctionWrappers(ExpressionContext *ctx)

{
  FunctionData *function;
  uint uVar1;
  int iVar2;
  ExprBase *pEVar3;
  Node *pNVar4;
  ulong uVar5;
  ulong uVar6;
  ExprFunctionAccess *expr;
  ArgumentData *pAVar7;
  InplaceStr functionName;
  DirectChainedMap<FunctionData_*> valueFunctions;
  TraceScope traceScope;
  DirectChainedMap<FunctionData_*> local_60;
  ulong local_48;
  TraceScope local_40;
  
  if ((CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token)
     , iVar2 != 0)) {
    CreateDefaultArgumentFunctionWrappers::token =
         NULLC::TraceGetToken("analyze","CreateDefaultArgumentFunctionWrappers");
    __cxa_guard_release(&CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&local_40,CreateDefaultArgumentFunctionWrappers::token);
  DirectChainedMap<FunctionData_*>::DirectChainedMap(&local_60,ctx->allocator);
  uVar1 = (ctx->functions).count;
  if (uVar1 != 0) {
    uVar5 = 0;
    do {
      function = (ctx->functions).data[uVar5];
      if (((function->importModule == (ModuleData *)0x0) &&
          (((function->scope == ctx->globalScope || (function->scope->ownerType != (TypeBase *)0x0))
           && (function->isHidden == false)))) && ((function->arguments).count != 0)) {
        uVar6 = 0;
        local_48 = uVar5;
        do {
          pAVar7 = (function->arguments).data;
          pEVar3 = pAVar7[uVar6].value;
          if (pEVar3 != (ExprBase *)0x0) {
            pAVar7 = pAVar7 + uVar6;
            if (pAVar7->valueFunction != (FunctionData *)0x0) {
              __assert_fail("argument.valueFunction == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x3446,
                            "void CreateDefaultArgumentFunctionWrappers(ExpressionContext &)");
            }
            if (pEVar3->type != (TypeBase *)0x0) {
              uVar1 = pEVar3->type->typeID;
              if (uVar1 == 0) goto LAB_001865d9;
              if (uVar1 == 0x1a) {
                pEVar3 = CreateCast(ctx,pAVar7->source,pEVar3,pAVar7->type,true);
              }
            }
            functionName = GetDefaultArgumentWrapperFunctionName(ctx,function,pAVar7->name->name);
            uVar1 = NULLC::GetStringHash(functionName.begin,functionName.end);
            uVar5 = (ulong)(local_60.bucketCount - 1 & uVar1);
            if (*(long *)(local_60.data + uVar5 * 0x18 + 0x10) != 0) {
              pNVar4 = local_60.data + uVar5 * 0x18;
              do {
                if (pNVar4 == (Node *)0x0) break;
                if (*(uint *)pNVar4 == uVar1) {
                  pAVar7->valueFunction = *(FunctionData **)(pNVar4 + 8);
                  goto LAB_001865d9;
                }
                pNVar4 = *(Node **)(pNVar4 + 0x10);
              } while (pNVar4 != local_60.data + uVar5 * 0x18);
            }
            pEVar3 = CreateValueFunctionWrapper
                               (ctx,pAVar7->source,(SynBase *)0x0,pEVar3,functionName);
            if (pEVar3 == (ExprBase *)0x0) {
LAB_00186645:
              __assert_fail("isType<ExprFunctionAccess>(access)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x345d,
                            "void CreateDefaultArgumentFunctionWrappers(ExpressionContext &)");
            }
            if (pEVar3->typeID != 0) {
              if (pEVar3->typeID != 0x26) goto LAB_00186645;
              pAVar7->valueFunction = (FunctionData *)pEVar3[1]._vptr_ExprBase;
              uVar1 = NULLC::GetStringHash(functionName.begin,functionName.end);
              DirectChainedMap<FunctionData_*>::insert
                        (&local_60,uVar1,(FunctionData *)pEVar3[1]._vptr_ExprBase);
            }
          }
LAB_001865d9:
          uVar6 = uVar6 + 1;
        } while (uVar6 < (function->arguments).count);
        uVar1 = (ctx->functions).count;
        uVar5 = local_48;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar1);
  }
  (*(local_60.allocator)->_vptr_Allocator[3])(local_60.allocator,local_60.data);
  NULLC::TraceScope::~TraceScope(&local_40);
  return;
}

Assistant:

void CreateDefaultArgumentFunctionWrappers(ExpressionContext &ctx)
{
	TRACE_SCOPE("analyze", "CreateDefaultArgumentFunctionWrappers");

	DirectChainedMap<FunctionData*> valueFunctions(ctx.allocator);

	for(unsigned i = 0; i < ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.functions[i];

		if(function->importModule)
			continue;

		// Handle only global visible functions
		if(function->scope != ctx.globalScope && !function->scope->ownerType)
			continue;

		if(function->isHidden)
			continue;

		// Go through all function arguments
		for(unsigned k = 0; k < function->arguments.size(); k++)
		{
			ArgumentData &argument = function->arguments[k];

			if(argument.value)
			{
				assert(argument.valueFunction == NULL);

				ExprBase *value = argument.value;

				if(isType<TypeError>(value->type))
					continue;

				if(isType<TypeFunctionSet>(value->type))
					value = CreateCast(ctx, argument.source, argument.value, argument.type, true);

				InplaceStr functionName = GetDefaultArgumentWrapperFunctionName(ctx, function, argument.name->name);

				if(FunctionData **valueFunction = valueFunctions.find(functionName.hash()))
				{
					argument.valueFunction = *valueFunction;
					continue;
				}

				ExprBase *access = CreateValueFunctionWrapper(ctx, argument.source, NULL, value, functionName);

				if(isType<ExprError>(access))
					continue;

				assert(isType<ExprFunctionAccess>(access));

				if(ExprFunctionAccess *expr = getType<ExprFunctionAccess>(access))
				{
					argument.valueFunction = expr->function;

					valueFunctions.insert(functionName.hash(), expr->function);
				}
			}
		}
	}
}